

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildRender8bppRectFromString
               (ImFontAtlas *atlas,int x,int y,int w,int h,char *in_str,char in_marker_char,
               uchar in_marker_pixel_value)

{
  uchar uVar1;
  int off_x;
  int off_y;
  uchar *out_pixel;
  char *in_str_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  ImFontAtlas *atlas_local;
  
  out_pixel = atlas->TexPixelsAlpha8 + (long)(y * atlas->TexWidth) + (long)x;
  in_str_local = in_str;
  for (off_y = 0; off_y < h; off_y = off_y + 1) {
    for (off_x = 0; off_x < w; off_x = off_x + 1) {
      uVar1 = in_marker_pixel_value;
      if (in_str_local[off_x] != in_marker_char) {
        uVar1 = '\0';
      }
      out_pixel[off_x] = uVar1;
    }
    out_pixel = out_pixel + atlas->TexWidth;
    in_str_local = in_str_local + w;
  }
  return;
}

Assistant:

void ImFontAtlasBuildRender8bppRectFromString(ImFontAtlas* atlas, int x, int y, int w, int h, const char* in_str, char in_marker_char, unsigned char in_marker_pixel_value)
{
    IM_ASSERT(x >= 0 && x + w <= atlas->TexWidth);
    IM_ASSERT(y >= 0 && y + h <= atlas->TexHeight);
    unsigned char* out_pixel = atlas->TexPixelsAlpha8 + x + (y * atlas->TexWidth);
    for (int off_y = 0; off_y < h; off_y++, out_pixel += atlas->TexWidth, in_str += w)
        for (int off_x = 0; off_x < w; off_x++)
            out_pixel[off_x] = (in_str[off_x] == in_marker_char) ? in_marker_pixel_value : 0x00;
}